

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::queryPointerState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum pname,
               QueriedState *state)

{
  bool bVar1;
  void **ppvVar2;
  QueriedState local_68;
  undefined1 local_40 [8];
  StateQueryMemoryWriteGuard<void_*> value;
  QueriedState *state_local;
  GLenum pname_local;
  QueryType type_local;
  CallLogWrapper *gl_local;
  ResultCollector *result_local;
  
  if (type == QUERY_POINTER) {
    value.m_postguard = state;
    StateQueryMemoryWriteGuard<void_*>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<void_*> *)local_40);
    ppvVar2 = StateQueryMemoryWriteGuard<void_*>::operator&
                        ((StateQueryMemoryWriteGuard<void_*> *)local_40);
    glu::CallLogWrapper::glGetPointerv(gl,pname,ppvVar2);
    bVar1 = checkError(result,gl,"glGetPointerv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<void_*>::verifyValidity
                          ((StateQueryMemoryWriteGuard<void_*> *)local_40,result), bVar1)) {
      ppvVar2 = StateQueryMemoryWriteGuard::operator_cast_to_void__
                          ((StateQueryMemoryWriteGuard *)local_40);
      QueriedState::QueriedState(&local_68,*ppvVar2);
      memcpy(value.m_postguard,&local_68,0x28);
    }
  }
  return;
}

Assistant:

void queryPointerState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum pname, QueriedState& state)
{
	switch (type)
	{
		case QUERY_POINTER:
		{
			StateQueryMemoryWriteGuard<void*> value;
			gl.glGetPointerv(pname, &value);

			if (!checkError(result, gl, "glGetPointerv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}